

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void deferred_on_shutdown(void *arg,void *arg2)

{
  fio_defer_task_s task;
  uint8_t uVar1;
  fio_protocol_s *pr_00;
  int *piVar2;
  int iVar3;
  uint8_t r;
  fio_protocol_s *pr;
  void *arg2_local;
  void *arg_local;
  
  iVar3 = (int)((ulong)arg >> 8);
  if (*(long *)((long)fio_data + (long)iVar3 * 0xa8 + 0x58) != 0) {
    pr_00 = protocol_try_lock((long)iVar3,FIO_PR_LOCK_TASK);
    if (pr_00 == (fio_protocol_s *)0x0) {
      piVar2 = __errno_location();
      if (*piVar2 != 9) {
        task.arg1 = arg;
        task.func = deferred_on_shutdown;
        task.arg2 = (void *)0x0;
        fio_defer_push_task_fn(task,&task_queue_normal);
        fio_defer_thread_signal();
      }
    }
    else {
      *(__time_t *)((long)fio_data + (long)iVar3 * 0xa8 + 0x60) = (fio_data->last_cycle).tv_sec;
      if (pr_00->on_shutdown == (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0) {
        uVar1 = '\0';
      }
      else {
        uVar1 = (*pr_00->on_shutdown)((intptr_t)arg,pr_00);
      }
      if (uVar1 == '\0') {
        LOCK();
        fio_data->connection_count = fio_data->connection_count + 1;
        UNLOCK();
        *(undefined1 *)((long)fio_data + (long)iVar3 * 0xa8 + 0x6a) = 8;
        pr_00->ping = mock_ping;
        protocol_unlock(pr_00,FIO_PR_LOCK_TASK);
        fio_close((intptr_t)arg);
      }
      else {
        if (uVar1 == 0xff) {
          *(undefined1 *)((long)fio_data + (long)iVar3 * 0xa8 + 0x6a) = 0;
        }
        else {
          LOCK();
          fio_data->connection_count = fio_data->connection_count + 1;
          UNLOCK();
          *(uint8_t *)((long)fio_data + (long)iVar3 * 0xa8 + 0x6a) = uVar1;
        }
        pr_00->ping = mock_ping2;
        protocol_unlock(pr_00,FIO_PR_LOCK_TASK);
      }
    }
  }
  return;
}

Assistant:

static void deferred_on_shutdown(void *arg, void *arg2) {
  if (!uuid_data(arg).protocol) {
    return;
  }
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(arg), FIO_PR_LOCK_TASK);
  if (!pr) {
    if (errno == EBADF)
      return;
    goto postpone;
  }
  touchfd(fio_uuid2fd(arg));
  uint8_t r = pr->on_shutdown ? pr->on_shutdown((intptr_t)arg, pr) : 0;
  if (r) {
    if (r == 255) {
      uuid_data(arg).timeout = 0;
    } else {
      fio_atomic_add(&fio_data->connection_count, 1);
      uuid_data(arg).timeout = r;
    }
    pr->ping = mock_ping2;
    protocol_unlock(pr, FIO_PR_LOCK_TASK);
  } else {
    fio_atomic_add(&fio_data->connection_count, 1);
    uuid_data(arg).timeout = 8;
    pr->ping = mock_ping;
    protocol_unlock(pr, FIO_PR_LOCK_TASK);
    fio_close((intptr_t)arg);
  }
  return;
postpone:
  fio_defer_push_task(deferred_on_shutdown, arg, NULL);
  (void)arg2;
}